

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_case_end(XmlReporter *this,CurrentTestCaseStats *st)

{
  XmlWriter *this_00;
  int *in_RSI;
  long in_RDI;
  double *in_stack_00000050;
  string *in_stack_00000058;
  XmlWriter *in_stack_00000060;
  string *in_stack_fffffffffffffe88;
  XmlWriter *in_stack_fffffffffffffe90;
  undefined1 attribute;
  allocator *paVar1;
  string *in_stack_fffffffffffffe98;
  XmlWriter *in_stack_fffffffffffffea0;
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  int local_70;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  int *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"OverallResultsAsserts",&local_31);
  XmlWriter::startElement(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  attribute = (undefined1)((ulong)in_stack_fffffffffffffe90 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"successes",&local_69);
  local_70 = *local_10 - local_10[1];
  this_00 = XmlWriter::writeAttribute<int>
                      (in_stack_00000060,in_stack_00000058,(int *)in_stack_00000050);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"failures",&local_91);
  XmlWriter::writeAttribute<int>(in_stack_00000060,in_stack_00000058,(int *)in_stack_00000050);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"test_case_success",&local_b9);
  XmlWriter::writeAttribute(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(bool)attribute);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if ((*(byte *)(*(long *)(in_RDI + 0x78) + 0x6f) & 1) != 0) {
    paVar1 = &local_e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"duration",paVar1);
    XmlWriter::writeAttribute<double>(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  if (*(int *)(*(long *)(in_RDI + 0x80) + 0x40) != 0) {
    paVar1 = &local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"expected_failures",paVar1);
    XmlWriter::writeAttribute<int>(in_stack_00000060,in_stack_00000058,(int *)in_stack_00000050);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  XmlWriter::endElement(this_00);
  XmlWriter::endElement(this_00);
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats& st) override {
            xml.startElement("OverallResultsAsserts")
                    .writeAttribute("successes",
                                    st.numAssertsCurrentTest - st.numAssertsFailedCurrentTest)
                    .writeAttribute("failures", st.numAssertsFailedCurrentTest)
                    .writeAttribute("test_case_success", st.testCaseSuccess);
            if(opt.duration)
                xml.writeAttribute("duration", st.seconds);
            if(tc->m_expected_failures)
                xml.writeAttribute("expected_failures", tc->m_expected_failures);
            xml.endElement();

            xml.endElement();
        }